

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O2

string * list_builtin_chat_templates_abi_cxx11_(void)

{
  pointer ppcVar1;
  int iVar2;
  ostream *poVar3;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range1;
  char *pcVar4;
  string *in_RDI;
  char **tmpl;
  pointer ppcVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> supported_tmpl;
  ostringstream msg;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_1c8;
  ostringstream local_1a8 [376];
  
  local_1c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = llama_chat_builtin_templates(0,0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_1c8,(long)iVar2);
  llama_chat_builtin_templates
            (local_1c8._M_impl.super__Vector_impl_data._M_start,
             (long)local_1c8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1c8._M_impl.super__Vector_impl_data._M_start >> 3);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  ppcVar1 = local_1c8._M_impl.super__Vector_impl_data._M_finish;
  for (ppcVar5 = local_1c8._M_impl.super__Vector_impl_data._M_start; ppcVar5 != ppcVar1;
      ppcVar5 = ppcVar5 + 1) {
    poVar3 = std::operator<<((ostream *)local_1a8,*ppcVar5);
    pcVar4 = ", ";
    if (ppcVar5 == local_1c8._M_impl.super__Vector_impl_data._M_finish + -1) {
      pcVar4 = "";
    }
    std::operator<<(poVar3,pcVar4);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_1c8);
  return in_RDI;
}

Assistant:

static std::string list_builtin_chat_templates() {
    std::vector<const char *> supported_tmpl;
    int32_t res = llama_chat_builtin_templates(nullptr, 0);
    supported_tmpl.resize(res);
    res = llama_chat_builtin_templates(supported_tmpl.data(), supported_tmpl.size());
    std::ostringstream msg;
    for (auto & tmpl : supported_tmpl) {
        msg << tmpl << (&tmpl == &supported_tmpl.back() ? "" : ", ");
    }
    return msg.str();
}